

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

bool deqp::gls::BuiltinPrecisionTests::contains<tcu::Vector<float,2>>
               (IVal *ival,Vector<float,_2> *value)

{
  bool bVar1;
  Vector<float,_2> *value_local;
  IVal *ival_local;
  
  bVar1 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                    (ival,value);
  return bVar1;
}

Assistant:

bool contains (const typename Traits<T>::IVal& ival, const T& value)
{
	return Traits<T>::doContains(ival, value);
}